

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O1

Var Js::HelperMethodWrapper16
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6,Var arg7,Var arg8,Var arg9,Var arg10,Var arg11,Var arg12,Var arg13,
              Var arg14,Var arg15,Var arg16)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebuggingFlags *this;
  Var pvVar4;
  AutoRegisterIgnoreExceptionWrapper local_58;
  Var local_50;
  Var local_48;
  Var local_40;
  ScriptContext *local_38;
  
  local_50 = arg4;
  local_48 = arg3;
  local_40 = arg2;
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xca,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) goto LAB_008bb810;
    *puVar3 = 0;
  }
  this = DebugManager::GetDebuggingFlags(scriptContext->threadContext->debugManager);
  bVar2 = DebuggingFlags::IsBuiltInWrapperPresent(this);
  if (bVar2) {
    pvVar4 = (Var)(*(code *)origHelperAddr)
                            (arg1,local_40,local_48,local_50,arg5,arg6,arg7,arg8,arg9,arg10,arg11,
                             arg12,arg13,arg14,arg15,arg16);
  }
  else {
    AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
              (&local_58,scriptContext->threadContext);
    local_38 = scriptContext;
    if (scriptContext == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/DiagHelperMethodWrapper.h"
                                  ,0x31,"(scriptContext)","scriptContext");
      if (!bVar2) {
LAB_008bb810:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pvVar4 = (Var)(*(code *)origHelperAddr)
                            (arg1,local_40,local_48,local_50,arg5,arg6,arg7,arg8,arg9,arg10,arg11,
                             arg12,arg13,arg14,arg15,arg16);
    AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_58);
  }
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper16(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6, Var arg7, Var arg8, Var arg9, Var arg10, Var arg11, Var arg12, Var arg13, Var arg14, Var arg15, Var arg16)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod16)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12, arg13, arg14, arg15, arg16);
        });
    }